

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int hash_find(HashTable *table,void *key,void **_value)

{
  void *pvVar1;
  uint32 uVar2;
  int iVar3;
  void *local_48;
  HashItem *prev;
  uint32 hash;
  void *data;
  HashItem *i;
  void **_value_local;
  void *key_local;
  HashTable *table_local;
  
  pvVar1 = table->data;
  uVar2 = calc_hash(table,key);
  local_48 = (void *)0x0;
  data = table->table[uVar2];
  while( true ) {
    if (data == (void *)0x0) {
      return 0;
    }
    iVar3 = (*table->keymatch)(key,*data,pvVar1);
    if (iVar3 != 0) break;
    local_48 = data;
    data = *(void **)((long)data + 0x10);
  }
  if (_value != (void **)0x0) {
    *_value = *(void **)((long)data + 8);
  }
  if ((table->stackable == 0) && (local_48 != (void *)0x0)) {
    if (*(void **)((long)local_48 + 0x10) != data) {
      __assert_fail("prev->next == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x41,"int hash_find(const HashTable *, const void *, const void **)");
    }
    *(undefined8 *)((long)local_48 + 0x10) = *(undefined8 *)((long)data + 0x10);
    *(HashItem **)((long)data + 0x10) = table->table[uVar2];
    table->table[uVar2] = (HashItem *)data;
  }
  return 1;
}

Assistant:

int hash_find(const HashTable *table, const void *key, const void **_value)
{
    HashItem *i;
    void *data = table->data;
    const uint32 hash = calc_hash(table, key);
    HashItem *prev = NULL;
    for (i = table->table[hash]; i != NULL; i = i->next)
    {
        if (table->keymatch(key, i->key, data))
        {
            if (_value != NULL)
                *_value = i->value;

            // Matched! Move to the front of list for faster lookup next time.
            //  (stackable tables have to remain in the same order, though!)
            if ((!table->stackable) && (prev != NULL))
            {
                assert(prev->next == i);
                prev->next = i->next;
                i->next = table->table[hash];
                table->table[hash] = i;
            } // if

            return 1;
        } // if

        prev = i;
    } // for

    return 0;
}